

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

void lj_snap_add(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  SnapEntry *pSVar4;
  IRIns *pIVar5;
  TValue *pTVar6;
  TRef TVar7;
  SnapEntry SVar8;
  TValue *pTVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  TValue *pTVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  SnapShot *pSVar18;
  
  uVar1 = (J->cur).nsnap;
  uVar10 = (ulong)uVar1;
  uVar3 = (J->cur).nsnapmap;
  uVar16 = (uint)uVar1;
  if (((uVar1 != 0) && ((J->cur).nins == (uint)(J->cur).snap[uVar10 - 1].ref)) ||
     ((J->mergesnap != '\0' && (-1 < (char)(J->guardemit).irt)))) {
    if (uVar16 != 1) {
      pSVar18 = (J->cur).snap;
      uVar10 = (ulong)(uVar16 - 1);
      uVar3 = pSVar18[uVar10].mapofs;
      goto LAB_00153535;
    }
    (J->fold).ins.field_0.ot = 0xc00;
    (J->fold).ins.field_1.op12 = 0;
    lj_ir_emit(J);
  }
  if (J->sizesnap <= uVar16) {
    lj_snap_grow_buf_(J,uVar1 + 1);
  }
  (J->cur).nsnap = (uint16_t)(uVar1 + 1);
  pSVar18 = (J->cur).snap;
LAB_00153535:
  uVar16 = 0;
  J->mergesnap = '\0';
  (J->guardemit).irt = '\0';
  uVar15 = J->maxslot + J->baseslot;
  uVar11 = uVar3 + uVar15 + 2;
  if (J->sizesnapmap < uVar11) {
    lj_snap_grow_map_(J,uVar11);
  }
  pSVar18 = pSVar18 + uVar10;
  pSVar4 = (J->cur).snapmap;
  if (uVar15 != 0) {
    uVar1 = J->chain[0xb];
    iVar17 = 0;
    uVar14 = 0;
    uVar10 = 0;
    do {
      uVar16 = J->slot[uVar14];
      if (uVar14 == 1) {
        SVar8 = 0x1057fff;
        if ((uVar16 >> 0x10 & 1) != 0) goto LAB_00153695;
      }
      else {
        uVar11 = uVar16 & 0xffff;
        if (uVar11 == 0 && (uVar16 & 0x30000) != 0) {
          TVar7 = lj_ir_k64(J,IR_KNUM,J->L->base[uVar14 - J->baseslot].u64);
          uVar16 = uVar16 & 0xff0000 | TVar7;
          J->slot[uVar14] = uVar16;
          uVar11 = TVar7 & 0xffff;
        }
        if (uVar11 != 0) {
          SVar8 = iVar17 + (uVar16 & 0x13ffff);
          pIVar5 = (J->cur).ir;
          uVar12 = (ulong)uVar11;
          if (((*(char *)((long)pIVar5 + uVar12 * 8 + 5) == 'G') &&
              (uVar14 == pIVar5[uVar12].field_0.op1)) && (uVar1 < uVar11)) {
            uVar2 = *(ushort *)((long)pIVar5 + uVar12 * 8 + 2);
            if (((uVar2 & 0x20) == 0) &&
               (((uVar14 == 0 || ((ulong)uVar15 - 1 == uVar14)) ||
                ((*(byte *)((long)J->slot + uVar14 * 4 + 6) & 3) == 0)))) goto LAB_0015369d;
            if ((uVar2 & 0x11) != 1) {
              SVar8 = iVar17 + 0x40000 + (uVar16 & 0x13ffff);
            }
          }
LAB_00153695:
          pSVar4[uVar3 + uVar10] = SVar8;
          uVar10 = (ulong)((int)uVar10 + 1);
        }
      }
LAB_0015369d:
      uVar16 = (uint)uVar10;
      uVar14 = uVar14 + 1;
      iVar17 = iVar17 + 0x1000000;
    } while (uVar15 != uVar14);
  }
  pSVar18->nent = (uint8_t)uVar16;
  pTVar6 = J->L->base;
  pTVar9 = pTVar6 + -1;
  uVar11 = J->baseslot;
  if (*(char *)((pTVar6[-2].u64 & 0x7fffffffffff) + 10) == '\0') {
    pTVar13 = pTVar9 + *(byte *)(*(long *)((pTVar6[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
  }
  else {
    pTVar13 = J->L->top;
  }
  *(ulong *)(pSVar4 + (ulong)uVar3 + (ulong)uVar16) = (ulong)(uVar11 - 2) | (long)J->pc << 8;
  if (2 < uVar11) {
    do {
      uVar10 = pTVar9->u64;
      if ((uVar10 & 3) == 0) {
        pTVar9 = pTVar9 + (-2 - (ulong)*(byte *)(uVar10 - 3));
LAB_0015376f:
        if (pTVar13 < pTVar9 + *(byte *)(*(long *)((pTVar9[-1].u64 & 0x7fffffffffff) + 0x20) + -0x5d
                                        )) {
          pTVar13 = pTVar9 + *(byte *)(*(long *)((pTVar9[-1].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
        }
      }
      else {
        pTVar9 = (TValue *)((long)pTVar9 - (uVar10 & 0xfffffffffffffff8));
        if (((uint)uVar10 & 7) == 2) goto LAB_0015376f;
      }
    } while (pTVar6 + (1 - (ulong)uVar11) < pTVar9);
  }
  pSVar18->topslot = (uint8_t)((uint)((int)pTVar13 - (int)(pTVar6 + (1 - (ulong)uVar11))) >> 3);
  pSVar18->mapofs = uVar3;
  pSVar18->ref = (IRRef1)(J->cur).nins;
  pSVar18->mcofs = 0;
  pSVar18->nslots = (uint8_t)uVar15;
  pSVar18->count = '\0';
  (J->cur).nsnapmap = uVar16 + uVar3 + 2;
  return;
}

Assistant:

void lj_snap_add(jit_State *J)
{
  MSize nsnap = J->cur.nsnap;
  MSize nsnapmap = J->cur.nsnapmap;
  /* Merge if no ins. inbetween or if requested and no guard inbetween. */
  if ((nsnap > 0 && J->cur.snap[nsnap-1].ref == J->cur.nins) ||
      (J->mergesnap && !irt_isguard(J->guardemit))) {
    if (nsnap == 1) {  /* But preserve snap #0 PC. */
      emitir_raw(IRT(IR_NOP, IRT_NIL), 0, 0);
      goto nomerge;
    }
    nsnapmap = J->cur.snap[--nsnap].mapofs;
  } else {
  nomerge:
    lj_snap_grow_buf(J, nsnap+1);
    J->cur.nsnap = (uint16_t)(nsnap+1);
  }
  J->mergesnap = 0;
  J->guardemit.irt = 0;
  snapshot_stack(J, &J->cur.snap[nsnap], nsnapmap);
}